

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O1

void av1_highbd_dist_wtd_convolve_2d_copy_c
               (uint16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
               ConvolveParams *conv_params,int bd)

{
  int iVar1;
  int iVar2;
  uint16_t *puVar3;
  char cVar4;
  char cVar5;
  ulong uVar6;
  byte bVar7;
  uint16_t *puVar8;
  ulong uVar9;
  long lVar10;
  uint16_t *puVar11;
  int iVar12;
  undefined2 uVar13;
  uint uVar14;
  int iVar15;
  
  cVar5 = (char)conv_params->round_0 + (char)conv_params->round_1;
  cVar4 = (char)bd - cVar5;
  if (0 < h) {
    puVar3 = conv_params->dst;
    bVar7 = 0xe - cVar5;
    iVar12 = (1 << (cVar4 + 0xdU & 0x1f)) + (1 << (cVar4 + 0xeU & 0x1f));
    iVar1 = conv_params->dst_stride;
    lVar10 = 0;
    uVar6 = 0;
    puVar11 = puVar3;
    do {
      if (0 < w) {
        iVar2 = conv_params->do_average;
        uVar9 = 0;
        do {
          uVar14 = ((uint)src[uVar9] << (bVar7 & 0x1f)) + iVar12;
          uVar13 = (undefined2)uVar14;
          puVar8 = puVar3;
          iVar15 = iVar1;
          if (iVar2 != 0) {
            if (conv_params->use_dist_wtd_comp_avg == 0) {
              uVar14 = (uVar14 & 0xffff) + (uint)puVar11[uVar9] >> 1;
            }
            else {
              uVar14 = (int)((uVar14 & 0xffff) * conv_params->bck_offset +
                            (uint)puVar11[uVar9] * conv_params->fwd_offset) >> 4;
            }
            iVar15 = (int)(uVar14 + (((1 << (bVar7 & 0x1f)) >> 1) - iVar12)) >> (bVar7 & 0x1f);
            if (bd == 10) {
              if (0x3fe < iVar15) {
                iVar15 = 0x3ff;
              }
            }
            else if (bd == 0xc) {
              if (0xffe < iVar15) {
                iVar15 = 0xfff;
              }
            }
            else if (0xfe < iVar15) {
              iVar15 = 0xff;
            }
            if (iVar15 < 1) {
              iVar15 = 0;
            }
            uVar13 = (undefined2)iVar15;
            puVar8 = dst;
            iVar15 = dst_stride;
          }
          *(undefined2 *)((long)puVar8 + uVar9 * 2 + iVar15 * lVar10) = uVar13;
          uVar9 = uVar9 + 1;
        } while ((uint)w != uVar9);
      }
      uVar6 = uVar6 + 1;
      puVar11 = puVar11 + iVar1;
      src = src + src_stride;
      lVar10 = lVar10 + 2;
    } while (uVar6 != (uint)h);
  }
  return;
}

Assistant:

void av1_highbd_dist_wtd_convolve_2d_copy_c(const uint16_t *src, int src_stride,
                                            uint16_t *dst, int dst_stride,
                                            int w, int h,
                                            ConvolveParams *conv_params,
                                            int bd) {
  CONV_BUF_TYPE *dst16 = conv_params->dst;
  int dst16_stride = conv_params->dst_stride;
  const int bits =
      FILTER_BITS * 2 - conv_params->round_1 - conv_params->round_0;
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  const int round_offset = (1 << (offset_bits - conv_params->round_1)) +
                           (1 << (offset_bits - conv_params->round_1 - 1));
  assert(bits >= 0);

  for (int y = 0; y < h; ++y) {
    for (int x = 0; x < w; ++x) {
      CONV_BUF_TYPE res = src[y * src_stride + x] << bits;
      res += round_offset;
      if (conv_params->do_average) {
        int32_t tmp = dst16[y * dst16_stride + x];
        if (conv_params->use_dist_wtd_comp_avg) {
          tmp = tmp * conv_params->fwd_offset + res * conv_params->bck_offset;
          tmp = tmp >> DIST_PRECISION_BITS;
        } else {
          tmp += res;
          tmp = tmp >> 1;
        }
        tmp -= round_offset;
        dst[y * dst_stride + x] =
            clip_pixel_highbd(ROUND_POWER_OF_TWO(tmp, bits), bd);
      } else {
        dst16[y * dst16_stride + x] = res;
      }
    }
  }
}